

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int KINGetNumLinFuncEvals(void *kinmem,long *nfevals)

{
  int iVar1;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINLsMem local_18;
  KINMem local_10;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINGetNumLinFuncEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *nfevals = local_18->nfeDQ;
  }
  return iVar1;
}

Assistant:

int KINGetNumLinFuncEvals(void *kinmem, long int *nfevals)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, "KINGetNumLinFuncEvals",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);
  *nfevals = kinls_mem->nfeDQ;
  return(KINLS_SUCCESS);
}